

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O1

walk_result __thiscall
jsoncons::jsonschema::
required_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
do_validate(required_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *context,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance,
           json_pointer *instance_location,evaluation_results *param_4,error_reporter *reporter,
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *param_6)

{
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  walk_result wVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  const_object_iterator cVar6;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  this_context;
  bool local_1e9;
  string_view_type local_1e8;
  long local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  required_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_1c8;
  error_reporter *local_1c0;
  json_pointer *local_1b8;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  local_180;
  undefined1 local_148 [24];
  bool local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  heap_string<char,_jsoncons::null_type,_std::allocator<char>_> *local_110;
  heap_string<char,_jsoncons::null_type,_std::allocator<char>_> local_100 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  long *local_68;
  long local_58 [2];
  vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
  local_48;
  
  local_1c0 = reporter;
  local_1b8 = instance_location;
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object(instance);
  wVar5 = advance;
  if (bVar1) {
    eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
    eval_context(&local_180,context,
                 &(this->
                  super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ).
                  super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  .keyword_name_);
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
             &(this->
              super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ).field_0xe0;
    local_1a8 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 &this->field_0xe8;
    local_1e9 = __rhs != local_1a8;
    local_1c8 = this;
    if (local_1e9) {
      local_1b0 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)instance;
      do {
        this_00 = local_1b0;
        local_1e8._M_str = (__rhs->_M_dataplus)._M_p;
        local_1e8._M_len = __rhs->_M_string_length;
        cVar6 = basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                          (local_1b0,&local_1e8);
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                  ((const_object_range_type *)local_148,this_00);
        if ((((undefined1  [16])cVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_130 & 1U) == 0)) {
          bVar1 = cVar6.has_value_ == local_130;
        }
        else {
          bVar1 = cVar6.it_._M_current._M_current ==
                  (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   *)local_148._16_8_;
        }
        if (bVar1) {
          std::operator+(&local_1a0,"Required property \'",__rhs);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          plVar4 = plVar3 + 2;
          if ((long *)*plVar3 == plVar4) {
            local_1d8 = *plVar4;
            uStack_1d0 = (undefined4)plVar3[3];
            uStack_1cc = *(undefined4 *)((long)plVar3 + 0x1c);
            local_1e8._M_len = (size_t)&local_1d8;
          }
          else {
            local_1d8 = *plVar4;
            local_1e8._M_len = (size_t)*plVar3;
          }
          local_1e8._M_str = (char *)plVar3[1];
          *plVar3 = (long)plVar4;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          (*(local_1c8->
            super_keyword_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            ).
            super_keyword_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            .super_validation_message_factory._vptr_validation_message_factory[2])
                    ((const_object_range_type *)local_148,local_1c8,&local_180.eval_path_,local_1b8,
                     &local_1e8);
          local_1c0->error_count_ = local_1c0->error_count_ + 1;
          iVar2 = (*local_1c0->_vptr_error_reporter[2])
                            (local_1c0,(const_object_range_type *)local_148);
          std::
          vector<jsoncons::jsonschema::validation_message,_std::allocator<jsoncons::jsonschema::validation_message>_>
          ::~vector(&local_48);
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_80);
          if (local_110 != local_100) {
            operator_delete(local_110,local_100[0]._0_8_ + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_128);
          if ((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)local_148._0_8_ !=
              (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
               *)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_,
                            (ulong)((long)&(((key_type *)local_148._16_8_)->_M_dataplus)._M_p + 1));
          }
          if ((long *)local_1e8._M_len != &local_1d8) {
            operator_delete((void *)local_1e8._M_len,local_1d8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          if (iVar2 == 1) break;
        }
        __rhs = __rhs + 1;
        local_1e9 = __rhs != local_1a8;
      } while (local_1e9);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_180.eval_path_.tokens_);
    if (local_180.dynamic_scope_.
        super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_180.dynamic_scope_.
                      super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_180.dynamic_scope_.
                            super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_180.dynamic_scope_.
                            super__Vector_base<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::allocator<const_jsoncons::jsonschema::schema_validator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    wVar5 = (walk_result)local_1e9;
  }
  return wVar5;
}

Assistant:

walk_result do_validate(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location,
            evaluation_results& /*results*/, 
            error_reporter& reporter, 
            Json& /*patch*/) const final
        {
            if (!instance.is_object())
            {
                return walk_result::advance;
            }

            eval_context<Json> this_context(context, this->keyword_name());

            for (const auto& key : items_)
            {
                if(instance.find(key) == instance.object_range().end())
                {
                    walk_result result = reporter.error(this->make_validation_message(
                        this_context.eval_path(),
                        instance_location, 
                        "Required property '" + key + "' not found."));
                    if(result == walk_result::abort)
                    {
                        return result;
                    }
                }
            }
            
            return walk_result::advance;
        }